

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int yaml_parser_process_empty_scalar(yaml_parser_t *parser,yaml_event_t *event,yaml_mark_t mark)

{
  yaml_char_t *pyVar1;
  
  pyVar1 = (yaml_char_t *)yaml_malloc(1);
  if (pyVar1 != (yaml_char_t *)0x0) {
    *pyVar1 = '\0';
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    parser = (yaml_parser_t *)&(event->data).scalar.style;
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = mark.index;
    (event->start_mark).line = mark.line;
    (event->start_mark).column = mark.column;
    (event->end_mark).index = mark.index;
    (event->end_mark).line = mark.line;
    (event->end_mark).column = mark.column;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).scalar.value = pyVar1;
    (event->data).scalar.plain_implicit = 1;
  }
  parser->error = YAML_PLAIN_SCALAR_STYLE;
  return (uint)(pyVar1 != (yaml_char_t *)0x0);
}

Assistant:

static int
yaml_parser_process_empty_scalar(yaml_parser_t *parser, yaml_event_t *event,
        yaml_mark_t mark)
{
    yaml_char_t *value;

    value = YAML_MALLOC(1);
    if (!value) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
    }
    value[0] = '\0';

    SCALAR_EVENT_INIT(*event, NULL, NULL, value, 0,
            1, 0, YAML_PLAIN_SCALAR_STYLE, mark, mark);

    return 1;
}